

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imstb_textedit.h
# Opt level: O3

void ImStb::stb_textedit_discard_undo(StbUndoState *state)

{
  undefined8 uVar1;
  ulong uVar2;
  ulong uVar3;
  short sVar4;
  ulong uVar5;
  long lVar6;
  ImWchar *__dest;
  long in_R8;
  long lVar7;
  undefined1 auVar8 [32];
  undefined1 auVar10 [32];
  undefined1 auVar11 [64];
  undefined1 auVar12 [64];
  undefined1 auVar13 [64];
  undefined1 auVar14 [64];
  undefined1 auVar15 [64];
  undefined1 auVar16 [64];
  undefined1 auVar17 [64];
  undefined1 auVar18 [64];
  undefined1 auVar19 [64];
  undefined1 auVar20 [64];
  undefined1 in_ZMM5 [64];
  undefined1 auVar9 [32];
  
  sVar4 = state->undo_point;
  if (0 < sVar4) {
    if (-1 < state->undo_rec[0].char_storage) {
      lVar7 = (long)state->undo_rec[0].insert_length;
      __dest = state->undo_char;
      lVar6 = state->undo_char_point - lVar7;
      state->undo_char_point = (int)lVar6;
      memmove(__dest,state->undo_char + lVar7,lVar6 * 2);
      sVar4 = state->undo_point;
      if (0 < sVar4) {
        auVar11 = vpmovsxbq_avx512f(ZEXT816(0xf0e0d0c0b0a0908));
        auVar12 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
        auVar13 = vpbroadcastq_avx512f(ZEXT816(0x10));
        auVar14 = vpbroadcastd_avx512f();
        auVar15 = vpbroadcastq_avx512f();
        auVar16 = vpternlogd_avx512f(in_ZMM5,in_ZMM5,in_ZMM5,0xff);
        uVar5 = (ulong)((int)sVar4 + 0xfU & 0xfff0);
        auVar17 = vpbroadcastq_avx512f();
        do {
          auVar18 = vpsllq_avx512f(auVar12,4);
          uVar2 = vpcmpuq_avx512f(auVar12,auVar17,2);
          auVar19 = vpsllq_avx512f(auVar11,4);
          uVar3 = vpcmpuq_avx512f(auVar11,auVar17,2);
          auVar12 = vpaddq_avx512f(auVar12,auVar13);
          auVar11 = vpaddq_avx512f(auVar11,auVar13);
          uVar5 = uVar5 - 0x10;
          auVar18 = vpaddq_avx512f(auVar15,auVar18);
          auVar19 = vpaddq_avx512f(auVar15,auVar19);
          auVar8 = vpgatherqd_avx512f(*(undefined8 *)(in_R8 + 0xc));
          auVar9 = vpgatherqd_avx512f(*(undefined8 *)(__dest + 6));
          auVar10._4_4_ = (uint)((byte)(uVar3 >> 1) & 1) * auVar9._4_4_;
          auVar10._0_4_ = (uint)((byte)uVar3 & 1) * auVar9._0_4_;
          auVar10._8_4_ = (uint)((byte)(uVar3 >> 2) & 1) * auVar9._8_4_;
          auVar10._12_4_ = (uint)((byte)(uVar3 >> 3) & 1) * auVar9._12_4_;
          auVar10._16_4_ = (uint)((byte)(uVar3 >> 4) & 1) * auVar9._16_4_;
          auVar10._20_4_ = (uint)((byte)(uVar3 >> 5) & 1) * auVar9._20_4_;
          auVar10._24_4_ = (uint)((byte)(uVar3 >> 6) & 1) * auVar9._24_4_;
          auVar10._28_4_ = (uint)(byte)(uVar3 >> 7) * auVar9._28_4_;
          auVar20 = vinserti64x4_avx512f
                              (ZEXT3264(CONCAT428((uint)(byte)(uVar2 >> 7) * auVar8._28_4_,
                                                  CONCAT424((uint)((byte)(uVar2 >> 6) & 1) *
                                                            auVar8._24_4_,
                                                            CONCAT420((uint)((byte)(uVar2 >> 5) & 1)
                                                                      * auVar8._20_4_,
                                                                      CONCAT416((uint)((byte)(uVar2 
                                                  >> 4) & 1) * auVar8._16_4_,
                                                  CONCAT412((uint)((byte)(uVar2 >> 3) & 1) *
                                                            auVar8._12_4_,
                                                            CONCAT48((uint)((byte)(uVar2 >> 2) & 1)
                                                                     * auVar8._8_4_,
                                                                     CONCAT44((uint)((byte)(uVar2 >>
                                                                                           1) & 1) *
                                                                              auVar8._4_4_,
                                                                              (uint)((byte)uVar2 & 1
                                                                                    ) * auVar8._0_4_
                                                                             )))))))),auVar10,1);
          uVar1 = vpcmpgtd_avx512f(auVar20,auVar16);
          auVar20 = vpsubd_avx512f(auVar20,auVar14);
          vpscatterqd_avx512f(ZEXT832(0xc) + auVar18._0_32_,(ulong)(byte)((byte)uVar2 & (byte)uVar1)
                              ,auVar20._0_32_);
          auVar8 = vextracti64x4_avx512f(auVar20,1);
          vpscatterqd_avx512f(ZEXT832(0xc) + auVar19._0_32_,
                              (ulong)(byte)((byte)uVar3 & (byte)((ulong)uVar1 >> 8)),auVar8);
        } while (uVar5 != 0);
      }
    }
    state->undo_point = sVar4 + -1;
    memmove(state,state->undo_rec + 1,(long)(short)(sVar4 + -1) << 4);
    return;
  }
  return;
}

Assistant:

static void stb_textedit_discard_undo(StbUndoState *state)
{
   if (state->undo_point > 0) {
      // if the 0th undo state has characters, clean those up
      if (state->undo_rec[0].char_storage >= 0) {
         int n = state->undo_rec[0].insert_length, i;
         // delete n characters from all other records
         state->undo_char_point -= n;
         STB_TEXTEDIT_memmove(state->undo_char, state->undo_char + n, (size_t) (state->undo_char_point*sizeof(STB_TEXTEDIT_CHARTYPE)));
         for (i=0; i < state->undo_point; ++i)
            if (state->undo_rec[i].char_storage >= 0)
               state->undo_rec[i].char_storage -= n; // @OPTIMIZE: get rid of char_storage and infer it
      }
      --state->undo_point;
      STB_TEXTEDIT_memmove(state->undo_rec, state->undo_rec+1, (size_t) (state->undo_point*sizeof(state->undo_rec[0])));
   }
}